

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

ParserResult * __thiscall
Catch::clara::detail::
BoundLambda<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/JamesBoer[P]Jinx/Tests/UnitTests/catch.hpp:9801:34)>
::setValue(ParserResult *__return_storage_ptr__,
          BoundLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_JamesBoer[P]Jinx_Tests_UnitTests_catch_hpp:9801:34)>
          *this,string *arg)

{
  int iVar1;
  Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
  *pSVar2;
  undefined4 extraout_var;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Catch::IReporterFactory>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Catch::IReporterFactory>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Catch::IReporterFactory>_>_>_>
  *this_00;
  const_iterator cVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> temp;
  string lcReporter;
  string local_d0;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  BasicResult<Catch::clara::detail::ParseResultType> local_50;
  
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  local_d0._M_string_length = 0;
  local_d0.field_2._M_local_buf[0] = '\0';
  ::std::__cxx11::string::_M_assign((string *)&local_d0);
  local_50.m_errorMessage._M_dataplus._M_p = (pointer)&local_50.m_errorMessage.field_2;
  local_50.super_ResultValueBase<Catch::clara::detail::ParseResultType>.super_ResultBase.m_type = Ok
  ;
  local_50.super_ResultValueBase<Catch::clara::detail::ParseResultType>.super_ResultBase._12_4_ = 0;
  local_50.super_ResultValueBase<Catch::clara::detail::ParseResultType>.super_ResultBase.
  _vptr_ResultBase = (_func_int **)&PTR__BasicResult_0024a858;
  local_50.m_errorMessage._M_string_length = 0;
  local_50.m_errorMessage.field_2._M_local_buf[0] = '\0';
  pSVar2 = Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
           ::getInternal();
  iVar1 = (*(pSVar2->super_RegistryHub).super_IRegistryHub._vptr_IRegistryHub[2])(pSVar2);
  this_00 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Catch::IReporterFactory>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Catch::IReporterFactory>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Catch::IReporterFactory>_>_>_>
             *)(**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x18))
                         ((long *)CONCAT44(extraout_var,iVar1));
  toLower(&local_b0,&local_d0);
  cVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Catch::IReporterFactory>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Catch::IReporterFactory>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Catch::IReporterFactory>_>_>_>
          ::find(this_00,&local_b0);
  if (&(this_00->_M_impl).super__Rb_tree_header == (_Rb_tree_header *)cVar3._M_node) {
    ::std::operator+(&local_90,"Unrecognized reporter, \'",&local_d0);
    ::std::operator+(&local_70,&local_90,"\'. Check available with --list-reporters");
    BasicResult<Catch::clara::detail::ParseResultType>::runtimeError
              (__return_storage_ptr__,&local_70);
    ::std::__cxx11::string::~string((string *)&local_70);
    ::std::__cxx11::string::~string((string *)&local_90);
  }
  else {
    ::std::__cxx11::string::_M_assign((string *)&((this->m_lambda).config)->reporterName);
    *(undefined8 *)
     &(__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseResultType>).
      super_ResultBase.m_type = 0;
    (__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseResultType>).
    super_ResultBase._vptr_ResultBase = (_func_int **)&PTR__BasicResult_0024a858;
    (__return_storage_ptr__->m_errorMessage)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_errorMessage).field_2;
    (__return_storage_ptr__->m_errorMessage)._M_string_length = 0;
    (__return_storage_ptr__->m_errorMessage).field_2._M_local_buf[0] = '\0';
  }
  ::std::__cxx11::string::~string((string *)&local_b0);
  BasicResult<Catch::clara::detail::ParseResultType>::~BasicResult(&local_50);
  ::std::__cxx11::string::~string((string *)&local_d0);
  return __return_storage_ptr__;
}

Assistant:

auto setValue( std::string const &arg ) -> ParserResult override {
            return invokeLambda<typename UnaryLambdaTraits<L>::ArgType>( m_lambda, arg );
        }